

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 build_size_definition(void)

{
  pointer *__ptr;
  __uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
  in_RDI;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  arguments;
  FunctionDefinition *local_58;
  undefined1 local_50 [40];
  function<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>)>
  local_28;
  
  local_50._8_8_ = (Block *)0x0;
  local_50._16_8_ = (Block *)0x0;
  local_50._24_8_ = (pointer)0x0;
  ninx::parser::element::Block::make_empty((Block *)local_50,(Block *)0x0);
  std::
  make_unique<ninx::parser::element::FunctionDefinition,char_const(&)[5],std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            ((char (*) [5])&local_58,
             (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
              *)"size",
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)(local_50 + 8));
  local_28.super__Function_base._M_functor._M_unused._M_object = (pointer)0x0;
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28._M_invoker =
       std::
       _Function_handler<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/element/Block.cpp:219:13)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>_(ninx::parser::element::Block_*,_std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/element/Block.cpp:219:13)>
       ::_M_manager;
  ninx::parser::element::FunctionDefinition::set_evaluator(local_58,&local_28);
  if ((__buckets_ptr)local_28.super__Function_base._M_manager != (__buckets_ptr)0x0) {
    (*local_28.super__Function_base._M_manager)(&local_28,&local_28,3);
  }
  *(FunctionDefinition **)
   in_RDI.
   super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
   ._M_t.
   super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
   .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl =
       local_58;
  if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_50._0_8_ + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
             *)(local_50 + 8));
  return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
          )(tuple<ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
            )in_RDI.
             super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl
  ;
}

Assistant:

std::unique_ptr<ninx::parser::element::FunctionDefinition> build_size_definition() {
    std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument>> arguments;
    auto body{ninx::parser::element::Block::make_empty(nullptr)};
    auto definition = std::make_unique<ninx::parser::element::FunctionDefinition>("size", std::move(arguments),
                                                                                  std::move(body));
    definition->set_evaluator(
            [](ninx::parser::element::Block *target, std::unique_ptr<ninx::parser::element::Block> args) {
                return ninx::parser::element::Block::make_text_block(target, boost::lexical_cast<std::string>(
                        target->get_children_count()));
            });
    return std::move(definition);
}